

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_owner_name_mbs(archive_match *a,match_list *list,char *name)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *in_RDX;
  undefined8 *in_RSI;
  char *p;
  match *m;
  char **in_stack_ffffffffffffffc8;
  archive_mstring *in_stack_ffffffffffffffd0;
  archive *a_00;
  
  if ((in_RDX != (char *)0x0) && (*in_RDX != '\0')) {
    for (a_00 = (archive *)*in_RSI; a_00 != (archive *)0x0; a_00 = *(archive **)a_00) {
      wVar1 = archive_mstring_get_mbs(a_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if ((wVar1 < L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
        wVar1 = error_nomem((archive_match *)0x11e82b);
        return wVar1;
      }
      if ((in_stack_ffffffffffffffd0 != (archive_mstring *)0x0) &&
         (iVar2 = strcmp((char *)in_stack_ffffffffffffffd0,in_RDX), iVar2 == 0)) {
        *(int *)&a_00->vtable = *(int *)&a_00->vtable + 1;
        return L'\x01';
      }
    }
  }
  return L'\0';
}

Assistant:

static int
match_owner_name_mbs(struct archive_match *a, struct match_list *list,
    const char *name)
{
	struct match *m;
	const char *p;

	if (name == NULL || *name == '\0')
		return (0);
	for (m = list->first; m; m = m->next) {
		if (archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p)
		    < 0 && errno == ENOMEM)
			return (error_nomem(a));
		if (p != NULL && strcmp(p, name) == 0) {
			m->matches++;
			return (1);
		}
	}
	return (0);
}